

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall tcu::shearMatrix(tcu *this,Vector<float,_2> *shear)

{
  float fVar1;
  float fVar2;
  Matrix<float,_2,_2> MVar3;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  *(undefined4 *)this = 0x3f800000;
  fVar1 = shear->m_data[0];
  *(float *)(this + 8) = fVar1;
  fVar2 = shear->m_data[1];
  *(float *)(this + 4) = fVar2;
  MVar3.m_data.m_data[0].m_data[0] = fVar1 * fVar2 + 1.0;
  MVar3.m_data.m_data[0].m_data[1] = 0.0;
  *(float *)(this + 0xc) = MVar3.m_data.m_data[0].m_data[0];
  MVar3.m_data.m_data[1].m_data[0] = fVar2;
  MVar3.m_data.m_data[1].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar3.m_data.m_data;
}

Assistant:

inline Matrix<float, 2, 2> shearMatrix (const Vector<float, 2>& shear)
{
	Matrix<float, 2, 2> mat;
	mat(0, 0) = 1.0f;
	mat(0, 1) = shear.x();
	mat(1, 0) = shear.y();
	mat(1, 1) = 1.0f + shear.x()*shear.y();
	return mat;
}